

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int binCollFunc(void *padFlag,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  int n;
  int rc;
  int local_34;
  int local_2c;
  
  local_34 = in_ECX;
  if (in_ESI < in_ECX) {
    local_34 = in_ESI;
  }
  local_2c = memcmp(in_RDX,in_R8,(long)local_34);
  if ((local_2c == 0) &&
     (((in_RDI == 0 ||
       (iVar1 = allSpaces((char *)((long)in_RDX + (long)local_34),in_ESI - local_34), iVar1 == 0))
      || (iVar1 = allSpaces((char *)((long)in_R8 + (long)local_34),in_ECX - local_34), iVar1 == 0)))
     ) {
    local_2c = in_ESI - in_ECX;
  }
  return local_2c;
}

Assistant:

static int binCollFunc(
  void *padFlag,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int rc, n;
  n = nKey1<nKey2 ? nKey1 : nKey2;
  /* EVIDENCE-OF: R-65033-28449 The built-in BINARY collation compares
  ** strings byte by byte using the memcmp() function from the standard C
  ** library. */
  rc = memcmp(pKey1, pKey2, n);
  if( rc==0 ){
    if( padFlag
     && allSpaces(((char*)pKey1)+n, nKey1-n)
     && allSpaces(((char*)pKey2)+n, nKey2-n)
    ){
      /* EVIDENCE-OF: R-31624-24737 RTRIM is like BINARY except that extra
      ** spaces at the end of either string do not change the result. In other
      ** words, strings will compare equal to one another as long as they
      ** differ only in the number of spaces at the end.
      */
    }else{
      rc = nKey1 - nKey2;
    }
  }
  return rc;
}